

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicRmwCmpxchgExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset)

{
  unsigned_long local_b0;
  Location local_a8;
  Var local_88;
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)2>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)2>_>_>
  local_40;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_38;
  Address local_30;
  Address offset_local;
  Address alignment_log2_local;
  BinaryReaderIR *pBStack_18;
  Index memidx_local;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_30 = offset;
  offset_local = alignment_log2;
  alignment_log2_local._4_4_ = memidx;
  pBStack_18 = this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,memidx,&local_a8);
  local_b0 = 1L << ((byte)offset_local & 0x3f);
  std::
  make_unique<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Opcode&,wabt::Var,unsigned_long_long,unsigned_long&>
            ((Opcode *)&local_40,(Var *)&this_local,(unsigned_long_long *)&local_88,&local_b0);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)2>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)2>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_38,&local_40);
  this_local._4_4_ = AppendExpr(this,&local_38);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_38);
  std::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)2>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)2>_>_>
  ::~unique_ptr(&local_40);
  Var::~Var(&local_88);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnAtomicRmwCmpxchgExpr(Opcode opcode,
                                              Index memidx,
                                              Address alignment_log2,
                                              Address offset) {
  return AppendExpr(std::make_unique<AtomicRmwCmpxchgExpr>(
      opcode, Var(memidx, GetLocation()), 1ull << alignment_log2, offset));
}